

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_do_read_interlace
               (png_row_infop row_info,png_bytep row,int pass,png_uint_32 transformations)

{
  png_byte pVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  size_t __n;
  ulong local_108;
  int local_fc;
  undefined1 local_f8 [4];
  int j_3;
  png_byte v_3 [8];
  png_uint_32 i_3;
  int jstop_3;
  png_bytep dp_3;
  png_bytep sp_3;
  png_size_t pixel_bytes;
  uint tmp_2;
  int j_2;
  uint uStack_c0;
  png_byte v_2;
  int jstop_2;
  png_uint_32 i_2;
  int s_inc_2;
  uint s_end_2;
  uint s_start_2;
  uint dshift_2;
  uint sshift_2;
  png_bytep dp_2;
  png_bytep sp_2;
  uint tmp_1;
  int j_1;
  png_byte v_1;
  png_uint_32 i_1;
  int jstop_1;
  int s_inc_1;
  uint s_end_1;
  uint s_start_1;
  uint dshift_1;
  uint sshift_1;
  png_bytep dp_1;
  png_bytep sp_1;
  uint tmp;
  int j;
  png_uint_32 i;
  int iStack_4c;
  png_byte v;
  int jstop;
  int s_inc;
  uint s_end;
  uint s_start;
  uint dshift;
  uint sshift;
  png_bytep dp;
  png_bytep sp;
  png_uint_32 final_width;
  png_uint_32 transformations_local;
  int pass_local;
  png_bytep row_local;
  png_row_infop row_info_local;
  
  if ((row != (png_bytep)0x0) && (row_info != (png_row_infop)0x0)) {
    uVar4 = row_info->width * png_do_read_interlace::png_pass_inc[pass];
    pVar1 = row_info->pixel_depth;
    if (pVar1 == '\x01') {
      dp = row + (row_info->width - 1 >> 3);
      _dshift = row + (uVar4 - 1 >> 3);
      uVar3 = png_do_read_interlace::png_pass_inc[pass];
      if ((transformations & 0x10000) == 0) {
        s_start = 7 - (row_info->width + 7 & 7);
        s_end = 7 - (uVar4 + 7 & 7);
        s_inc = 0;
        jstop = 7;
        iStack_4c = 1;
      }
      else {
        s_start = row_info->width + 7 & 7;
        s_end = uVar4 + 7 & 7;
        s_inc = 7;
        jstop = 0;
        iStack_4c = -1;
      }
      for (tmp = 0; tmp < row_info->width; tmp = tmp + 1) {
        bVar2 = *dp;
        for (sp_1._4_4_ = 0; sp_1._4_4_ < (int)uVar3; sp_1._4_4_ = sp_1._4_4_ + 1) {
          *_dshift = ((byte)((int)(uint)bVar2 >> ((byte)s_start & 0x1f)) & 1) <<
                     ((byte)s_end & 0x1f) | *_dshift & (byte)(0x7f7f >> (7 - (byte)s_end & 0x1f));
          if (s_end == jstop) {
            s_end = s_inc;
            _dshift = _dshift + -1;
          }
          else {
            s_end = s_end + iStack_4c;
          }
        }
        if (s_start == jstop) {
          s_start = s_inc;
          dp = dp + -1;
        }
        else {
          s_start = s_start + iStack_4c;
        }
      }
    }
    else if (pVar1 == '\x02') {
      dp_1 = row + (row_info->width - 1 >> 2);
      _dshift_1 = row + (uVar4 - 1 >> 2);
      uVar3 = png_do_read_interlace::png_pass_inc[pass];
      if ((transformations & 0x10000) == 0) {
        s_start_1 = (3 - (row_info->width + 3 & 3)) * 2;
        s_end_1 = (3 - (uVar4 + 3 & 3)) * 2;
        s_inc_1 = 0;
        jstop_1 = 6;
        i_1 = 2;
      }
      else {
        s_start_1 = (row_info->width + 3 & 3) << 1;
        s_end_1 = (uVar4 + 3 & 3) << 1;
        s_inc_1 = 6;
        jstop_1 = 0;
        i_1 = 0xfffffffe;
      }
      for (j_1 = 0; (uint)j_1 < row_info->width; j_1 = j_1 + 1) {
        bVar2 = *dp_1;
        for (sp_2._4_4_ = 0; sp_2._4_4_ < (int)uVar3; sp_2._4_4_ = sp_2._4_4_ + 1) {
          *_dshift_1 = ((byte)((int)(uint)bVar2 >> ((byte)s_start_1 & 0x1f)) & 3) <<
                       ((byte)s_end_1 & 0x1f) |
                       *_dshift_1 & (byte)(0x3f3f >> (6 - (byte)s_end_1 & 0x1f));
          if (s_end_1 == jstop_1) {
            s_end_1 = s_inc_1;
            _dshift_1 = _dshift_1 + -1;
          }
          else {
            s_end_1 = s_end_1 + i_1;
          }
        }
        if (s_start_1 == jstop_1) {
          s_start_1 = s_inc_1;
          dp_1 = dp_1 + -1;
        }
        else {
          s_start_1 = s_start_1 + i_1;
        }
      }
    }
    else if (pVar1 == '\x04') {
      dp_2 = row + (row_info->width - 1 >> 1);
      _dshift_2 = row + (uVar4 - 1 >> 1);
      uVar3 = png_do_read_interlace::png_pass_inc[pass];
      if ((transformations & 0x10000) == 0) {
        s_start_2 = (1 - (row_info->width + 1 & 1)) * 4;
        s_end_2 = (1 - (uVar4 + 1 & 1)) * 4;
        s_inc_2 = 0;
        i_2 = 4;
        jstop_2 = 4;
      }
      else {
        s_start_2 = (row_info->width + 1 & 1) << 2;
        s_end_2 = (uVar4 + 1 & 1) << 2;
        s_inc_2 = 4;
        i_2 = 0;
        jstop_2 = -4;
      }
      for (uStack_c0 = 0; uStack_c0 < row_info->width; uStack_c0 = uStack_c0 + 1) {
        bVar2 = *dp_2;
        for (pixel_bytes._4_4_ = 0; pixel_bytes._4_4_ < (int)uVar3;
            pixel_bytes._4_4_ = pixel_bytes._4_4_ + 1) {
          *_dshift_2 = ((byte)((int)(uint)bVar2 >> ((byte)s_start_2 & 0x1f)) & 0xf) <<
                       ((byte)s_end_2 & 0x1f) |
                       *_dshift_2 & (byte)(0xf0f >> (4 - (byte)s_end_2 & 0x1f));
          if (s_end_2 == i_2) {
            s_end_2 = s_inc_2;
            _dshift_2 = _dshift_2 + -1;
          }
          else {
            s_end_2 = s_end_2 + jstop_2;
          }
        }
        if (s_start_2 == i_2) {
          s_start_2 = s_inc_2;
          dp_2 = dp_2 + -1;
        }
        else {
          s_start_2 = s_start_2 + jstop_2;
        }
      }
    }
    else {
      __n = (size_t)((int)(uint)row_info->pixel_depth >> 3);
      dp_3 = row + (row_info->width - 1) * __n;
      _i_3 = row + (uVar4 - 1) * __n;
      v_3._4_4_ = png_do_read_interlace::png_pass_inc[pass];
      v_3[0] = '\0';
      v_3[1] = '\0';
      v_3[2] = '\0';
      v_3[3] = '\0';
      for (; (uint)v_3._0_4_ < row_info->width; v_3._0_4_ = v_3._0_4_ + 1) {
        memcpy(local_f8,dp_3,__n);
        for (local_fc = 0; local_fc < (int)v_3._4_4_; local_fc = local_fc + 1) {
          memcpy(_i_3,local_f8,__n);
          _i_3 = _i_3 + -__n;
        }
        dp_3 = dp_3 + -__n;
      }
    }
    row_info->width = uVar4;
    if (row_info->pixel_depth < 8) {
      local_108 = (ulong)uVar4 * (ulong)row_info->pixel_depth + 7 >> 3;
    }
    else {
      local_108 = (ulong)uVar4 * (ulong)(row_info->pixel_depth >> 3);
    }
    row_info->rowbytes = local_108;
  }
  return;
}

Assistant:

void /* PRIVATE */
png_do_read_interlace(png_row_infop row_info, png_bytep row, int pass,
    png_uint_32 transformations /* Because these may affect the byte layout */)
{
   /* Arrays to facilitate easy interlacing - use pass (0 - 6) as index */
   /* Offset to next interlace block */
   static PNG_CONST unsigned int png_pass_inc[7] = {8, 8, 4, 4, 2, 2, 1};

   png_debug(1, "in png_do_read_interlace");
   if (row != NULL && row_info != NULL)
   {
      png_uint_32 final_width;

      final_width = row_info->width * png_pass_inc[pass];

      switch (row_info->pixel_depth)
      {
         case 1:
         {
            png_bytep sp = row + (png_size_t)((row_info->width - 1) >> 3);
            png_bytep dp = row + (png_size_t)((final_width - 1) >> 3);
            unsigned int sshift, dshift;
            unsigned int s_start, s_end;
            int s_inc;
            int jstop = (int)png_pass_inc[pass];
            png_byte v;
            png_uint_32 i;
            int j;

#ifdef PNG_READ_PACKSWAP_SUPPORTED
            if ((transformations & PNG_PACKSWAP) != 0)
            {
                sshift = ((row_info->width + 7) & 0x07);
                dshift = ((final_width + 7) & 0x07);
                s_start = 7;
                s_end = 0;
                s_inc = -1;
            }

            else
#endif
            {
                sshift = 7 - ((row_info->width + 7) & 0x07);
                dshift = 7 - ((final_width + 7) & 0x07);
                s_start = 0;
                s_end = 7;
                s_inc = 1;
            }

            for (i = 0; i < row_info->width; i++)
            {
               v = (png_byte)((*sp >> sshift) & 0x01);
               for (j = 0; j < jstop; j++)
               {
                  unsigned int tmp = *dp & (0x7f7f >> (7 - dshift));
                  tmp |= (unsigned int)(v << dshift);
                  *dp = (png_byte)(tmp & 0xff);

                  if (dshift == s_end)
                  {
                     dshift = s_start;
                     dp--;
                  }

                  else
                     dshift = (unsigned int)((int)dshift + s_inc);
               }

               if (sshift == s_end)
               {
                  sshift = s_start;
                  sp--;
               }

               else
                  sshift = (unsigned int)((int)sshift + s_inc);
            }
            break;
         }

         case 2:
         {
            png_bytep sp = row + (png_uint_32)((row_info->width - 1) >> 2);
            png_bytep dp = row + (png_uint_32)((final_width - 1) >> 2);
            unsigned int sshift, dshift;
            unsigned int s_start, s_end;
            int s_inc;
            int jstop = (int)png_pass_inc[pass];
            png_uint_32 i;

#ifdef PNG_READ_PACKSWAP_SUPPORTED
            if ((transformations & PNG_PACKSWAP) != 0)
            {
               sshift = (((row_info->width + 3) & 0x03) << 1);
               dshift = (((final_width + 3) & 0x03) << 1);
               s_start = 6;
               s_end = 0;
               s_inc = -2;
            }

            else
#endif
            {
               sshift = ((3 - ((row_info->width + 3) & 0x03)) << 1);
               dshift = ((3 - ((final_width + 3) & 0x03)) << 1);
               s_start = 0;
               s_end = 6;
               s_inc = 2;
            }

            for (i = 0; i < row_info->width; i++)
            {
               png_byte v;
               int j;

               v = (png_byte)((*sp >> sshift) & 0x03);
               for (j = 0; j < jstop; j++)
               {
                  unsigned int tmp = *dp & (0x3f3f >> (6 - dshift));
                  tmp |= (unsigned int)(v << dshift);
                  *dp = (png_byte)(tmp & 0xff);

                  if (dshift == s_end)
                  {
                     dshift = s_start;
                     dp--;
                  }

                  else
                     dshift = (unsigned int)((int)dshift + s_inc);
               }

               if (sshift == s_end)
               {
                  sshift = s_start;
                  sp--;
               }

               else
                  sshift = (unsigned int)((int)sshift + s_inc);
            }
            break;
         }

         case 4:
         {
            png_bytep sp = row + (png_size_t)((row_info->width - 1) >> 1);
            png_bytep dp = row + (png_size_t)((final_width - 1) >> 1);
            unsigned int sshift, dshift;
            unsigned int s_start, s_end;
            int s_inc;
            png_uint_32 i;
            int jstop = (int)png_pass_inc[pass];

#ifdef PNG_READ_PACKSWAP_SUPPORTED
            if ((transformations & PNG_PACKSWAP) != 0)
            {
               sshift = (((row_info->width + 1) & 0x01) << 2);
               dshift = (((final_width + 1) & 0x01) << 2);
               s_start = 4;
               s_end = 0;
               s_inc = -4;
            }

            else
#endif
            {
               sshift = ((1 - ((row_info->width + 1) & 0x01)) << 2);
               dshift = ((1 - ((final_width + 1) & 0x01)) << 2);
               s_start = 0;
               s_end = 4;
               s_inc = 4;
            }

            for (i = 0; i < row_info->width; i++)
            {
               png_byte v = (png_byte)((*sp >> sshift) & 0x0f);
               int j;

               for (j = 0; j < jstop; j++)
               {
                  unsigned int tmp = *dp & (0xf0f >> (4 - dshift));
                  tmp |= (unsigned int)(v << dshift);
                  *dp = (png_byte)(tmp & 0xff);

                  if (dshift == s_end)
                  {
                     dshift = s_start;
                     dp--;
                  }

                  else
                     dshift = (unsigned int)((int)dshift + s_inc);
               }

               if (sshift == s_end)
               {
                  sshift = s_start;
                  sp--;
               }

               else
                  sshift = (unsigned int)((int)sshift + s_inc);
            }
            break;
         }

         default:
         {
            png_size_t pixel_bytes = (row_info->pixel_depth >> 3);

            png_bytep sp = row + (png_size_t)(row_info->width - 1)
                * pixel_bytes;

            png_bytep dp = row + (png_size_t)(final_width - 1) * pixel_bytes;

            int jstop = (int)png_pass_inc[pass];
            png_uint_32 i;

            for (i = 0; i < row_info->width; i++)
            {
               png_byte v[8]; /* SAFE; pixel_depth does not exceed 64 */
               int j;

               memcpy(v, sp, pixel_bytes);

               for (j = 0; j < jstop; j++)
               {
                  memcpy(dp, v, pixel_bytes);
                  dp -= pixel_bytes;
               }

               sp -= pixel_bytes;
            }
            break;
         }
      }

      row_info->width = final_width;
      row_info->rowbytes = PNG_ROWBYTES(row_info->pixel_depth, final_width);
   }
#ifndef PNG_READ_PACKSWAP_SUPPORTED
   PNG_UNUSED(transformations)  /* Silence compiler warning */
#endif
}